

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha2.c
# Opt level: O0

char * SHA256_End(SHA256_CTX *context,char *buffer)

{
  char *pcVar1;
  int local_44;
  sha2_byte **ppsStack_40;
  int i;
  sha2_byte *d;
  sha2_byte digest [32];
  char *buffer_local;
  SHA256_CTX *context_local;
  
  ppsStack_40 = &d;
  digest._24_8_ = buffer;
  if (context != (SHA256_CTX *)0x0) {
    if (buffer == (char *)0x0) {
      memset(context,0,0x68);
    }
    else {
      SHA256_Final((uchar *)&d,(SHA256_CTX *)context);
      for (local_44 = 0; local_44 < 0x20; local_44 = local_44 + 1) {
        pcVar1 = (char *)(digest._24_8_ + 1);
        *(char *)digest._24_8_ = sha2_hex_digits[(int)(*(byte *)ppsStack_40 & 0xf0) >> 4];
        digest._24_8_ = digest._24_8_ + 2;
        *pcVar1 = sha2_hex_digits[(int)(*(byte *)ppsStack_40 & 0xf)];
        ppsStack_40 = (sha2_byte **)((long)ppsStack_40 + 1);
      }
      *(undefined1 *)digest._24_8_ = 0;
    }
    memset(&d,0,0x20);
    return (char *)digest._24_8_;
  }
  __assert_fail("context != (SHA256_CTX*)0",
                "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/src/sha2.c",
                0x275,"char *SHA256_End(SHA256_CTX *, char *)");
}

Assistant:

char *SHA256_End(SHA256_CTX* context, char buffer[SHA256_DIGEST_STRING_LENGTH]) {
	sha2_byte	digest[SHA256_DIGEST_LENGTH], *d = digest;
	int		i;

	/* Sanity check: */
	assert(context != (SHA256_CTX*)0);

	if (buffer != (char*)0) {
		SHA256_Final(digest, context);

		for (i = 0; i < SHA256_DIGEST_LENGTH; i++) {
			*buffer++ = sha2_hex_digits[(*d & 0xf0) >> 4];
			*buffer++ = sha2_hex_digits[*d & 0x0f];
			d++;
		}
		*buffer = (char)0;
	} else {
		MEMSET_BZERO(context, sizeof(SHA256_CTX));
	}
	MEMSET_BZERO(digest, SHA256_DIGEST_LENGTH);
	return buffer;
}